

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

void __thiscall
ThreadedReplayer::compute_parents_depth<ThreadedReplayer::DeferredComputeInfo>
          (ThreadedReplayer *this,
          unordered_map<unsigned_long,_ThreadedReplayer::DeferredComputeInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>_>
          *parents,unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
                   *parents_depth,DeferredComputeInfo *info,uint32_t depth)

{
  uint uVar1;
  DeferredComputeInfo *parents_depth_00;
  unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
  *parents_00;
  mapped_type *pmVar2;
  uint *puVar3;
  size_type sVar4;
  mapped_type *info_00;
  VkPipeline local_48;
  Hash parent;
  VkPipelineLibraryCreateInfoKHR *pVStack_38;
  uint32_t i;
  VkPipelineLibraryCreateInfoKHR *library;
  DeferredComputeInfo *pDStack_28;
  uint32_t depth_local;
  DeferredComputeInfo *info_local;
  unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
  *parents_depth_local;
  unordered_map<unsigned_long,_ThreadedReplayer::DeferredComputeInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>_>
  *parents_local;
  ThreadedReplayer *this_local;
  
  library._4_4_ = depth;
  pDStack_28 = info;
  info_local = (DeferredComputeInfo *)parents_depth;
  parents_depth_local =
       (unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
        *)parents;
  parents_local =
       (unordered_map<unsigned_long,_ThreadedReplayer::DeferredComputeInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>_>
        *)this;
  pmVar2 = std::
           unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
           ::at(parents_depth,&info->hash);
  puVar3 = std::max<unsigned_int>(pmVar2,(uint *)((long)&library + 4));
  uVar1 = *puVar3;
  pmVar2 = std::
           unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
           ::operator[]((unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
                         *)info_local,&pDStack_28->hash);
  *pmVar2 = uVar1;
  pVStack_38 = work_item_get_library_info<ThreadedReplayer::DeferredComputeInfo>(pDStack_28);
  if (pVStack_38 != (VkPipelineLibraryCreateInfoKHR *)0x0) {
    for (parent._4_4_ = 0; parent._4_4_ < pVStack_38->libraryCount; parent._4_4_ = parent._4_4_ + 1)
    {
      local_48 = pVStack_38->pLibraries[parent._4_4_];
      sVar4 = std::
              unordered_map<unsigned_long,_ThreadedReplayer::DeferredComputeInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>_>
              ::count((unordered_map<unsigned_long,_ThreadedReplayer::DeferredComputeInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>_>
                       *)parents_depth_local,(key_type *)&local_48);
      if ((sVar4 != 0) &&
         (pmVar2 = std::
                   unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
                   ::at((unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
                         *)info_local,(key_type *)&local_48), parents_00 = parents_depth_local,
         parents_depth_00 = info_local, *pmVar2 <= library._4_4_)) {
        info_00 = std::
                  unordered_map<unsigned_long,_ThreadedReplayer::DeferredComputeInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>_>
                  ::at((unordered_map<unsigned_long,_ThreadedReplayer::DeferredComputeInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>_>
                        *)parents_depth_local,(key_type *)&local_48);
        compute_parents_depth<ThreadedReplayer::DeferredComputeInfo>
                  (this,(unordered_map<unsigned_long,_ThreadedReplayer::DeferredComputeInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>_>
                         *)parents_00,
                   (unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
                    *)parents_depth_00,info_00,library._4_4_ + 1);
      }
    }
  }
  return;
}

Assistant:

void compute_parents_depth(const unordered_map<Hash, DerivedInfo> &parents,
	                           unordered_map<Hash, uint32_t> &parents_depth,
	                           const DerivedInfo &info, uint32_t depth)
	{
		parents_depth[info.hash] = max(parents_depth.at(info.hash), depth);

		auto library = work_item_get_library_info(info);
		if (!library)
			return;

		for (uint32_t i = 0; i < library->libraryCount; i++)
		{
			Hash parent = (Hash)library->pLibraries[i];
			if (parents.count(parent) != 0 && parents_depth.at(parent) <= depth)
				compute_parents_depth(parents, parents_depth, parents.at(parent), depth + 1);
		}
	}